

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Convolution::Convolution(Convolution *this,int filterLength,double *filter)

{
  uint n;
  int iVar1;
  int *ip;
  double *w;
  double *a;
  double *pdVar2;
  int iVar3;
  ulong uVar5;
  int iVar4;
  
  this->m_filter_len = filterLength;
  n = filterLength * 2;
  this->m_fft_len = n;
  iVar3 = 0;
  do {
    iVar4 = iVar3;
    iVar3 = iVar4 + 1;
    iVar1 = 2 << ((byte)iVar3 & 0x1f);
  } while (SBORROW4(iVar1,n) != iVar1 + filterLength * -2 < 0);
  this->m_fft_n = iVar3;
  iVar3 = 2 << ((byte)((iVar3 - (iVar4 >> 0x1f)) - 1U >> 1) & 0x1f);
  iVar1 = 2 << ((byte)iVar4 & 0x1f);
  this->m_ip_len = iVar3 + 2;
  this->m_w_len = iVar1;
  uVar5 = (long)iVar3 * 4 + 8;
  if (iVar3 < -2) {
    uVar5 = 0xffffffffffffffff;
  }
  ip = (int *)operator_new__(uVar5);
  this->m_ip = ip;
  uVar5 = (long)iVar1 * 8;
  if (iVar1 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  w = (double *)operator_new__(uVar5);
  this->m_work = w;
  uVar5 = (ulong)n * 8;
  if (filterLength < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  a = (double *)operator_new__(uVar5);
  this->m_filter = a;
  pdVar2 = (double *)operator_new__(uVar5);
  this->m_fft_buff = pdVar2;
  pdVar2 = (double *)operator_new__(uVar5);
  this->m_filter_result = pdVar2;
  *ip = 0;
  if (0 < filterLength) {
    uVar5 = 0;
    memset(pdVar2,0,(ulong)n << 3);
    do {
      a[uVar5] = filter[uVar5] * (1.0 / (double)filterLength);
      uVar5 = uVar5 + 1;
    } while ((uint)filterLength != uVar5);
  }
  if (filterLength < (int)n) {
    memset(a + filterLength,0,(ulong)(filterLength - 1) * 8 + 8);
  }
  rdft(n,1,a,ip,w);
  return;
}

Assistant:

Convolution(int filterLength, const double *filter)
	{
		m_filter_len = filterLength;
		m_fft_len = filterLength * 2;
		m_fft_n = 1;
		while ((2 << m_fft_n) < m_fft_len) {
			m_fft_n++;
		}
		m_ip_len = 2 + (2 << ((m_fft_n - 1)/2));
		m_w_len = 2 << (m_fft_n - 1);
		m_ip = new int[m_ip_len];
		m_work = new double[m_w_len];
		m_filter = new double[m_fft_len];
		m_fft_buff = new double[m_fft_len];
		m_filter_result = new double[m_fft_len];
		
		m_ip[0] = 0;
		
		for (int i=0; i<m_fft_len; ++i) {
			m_filter_result[i] = .0;
		}
		
		for (int i=0; i<m_filter_len; ++i) {
			m_filter[i] = filter[i] * (1.0 / m_filter_len);
		}
		for (int i=m_filter_len; i<m_fft_len; ++i) {
			m_filter[i] = .0;
		}
		rdft(m_fft_len, 1, m_filter, m_ip, m_work);
	}